

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

int setup_global(MIR_context_t ctx,char *name,void *addr,MIR_item_t_conflict def)

{
  MIR_module_t_conflict pMVar1;
  int iVar2;
  MIR_item_t_conflict item;
  char *pcVar3;
  MIR_context_t ctx_00;
  bool bVar4;
  bool bVar5;
  MIR_item_t_conflict tab_item_1;
  MIR_item_t_conflict tab_item;
  MIR_item item_s;
  MIR_item_t_conflict local_108;
  MIR_item_t_conflict local_100 [17];
  MIR_item local_78;
  
  pMVar1 = ctx->curr_module;
  ctx->curr_module = &ctx->environment_module;
  item = create_item(ctx,MIR_import_item,"import");
  ctx_00 = ctx;
  pcVar3 = get_ctx_str(ctx,name);
  (item->u).import_id = pcVar3;
  local_100[0] = (MIR_item_t_conflict)MIR_item_name(ctx_00,item);
  local_78.item_type = MIR_func_item;
  local_78.u.func = (MIR_func_t)local_100;
  local_78.module = &ctx->environment_module;
  iVar2 = HTAB_MIR_item_t_do(ctx->module_item_tab,&local_78,HTAB_FIND,&local_108);
  local_100[0] = (MIR_item_t_conflict)0x0;
  if (iVar2 != 0) {
    local_100[0] = local_108;
  }
  bVar4 = local_100[0] == item;
  bVar5 = local_100[0] == (MIR_item_t_conflict)0x0;
  if (bVar5 || bVar4) {
    HTAB_MIR_item_t_do(ctx->module_item_tab,item,HTAB_INSERT,local_100);
    DLIST_MIR_item_t_append(&(ctx->environment_module).items,item);
    local_100[0] = item;
  }
  else {
    free(item);
  }
  local_100[0]->addr = addr;
  local_100[0]->ref_def = def;
  ctx->curr_module = pMVar1;
  return (uint)(!bVar5 && !bVar4);
}

Assistant:

static int setup_global (MIR_context_t ctx, const char *name, void *addr, MIR_item_t def) {
  MIR_item_t item, tab_item;
  MIR_module_t saved = curr_module;
  int redef_p = FALSE;

  curr_module = &environment_module;
  /* Use import for proto representation: */
  item = new_export_import_forward (ctx, name, MIR_import_item, "import", TRUE);
  if ((tab_item = item_tab_find (ctx, MIR_item_name (ctx, item), &environment_module)) != item
      && tab_item != NULL) {
    free (item);
    redef_p = TRUE;
  } else {
    HTAB_DO (MIR_item_t, module_item_tab, item, HTAB_INSERT, tab_item);
    DLIST_APPEND (MIR_item_t, environment_module.items, item);
    tab_item = item;
  }
  tab_item->addr = addr;
  tab_item->ref_def = def;
  curr_module = saved;
  return redef_p;
}